

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp2_fast_iVar5(uint *pInOut,int iQ,int jQ,int nWords,int *pDifStart)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  if (0 < nWords) {
    iVar2 = nWords * 2;
    lVar1 = (long)(nWords * 2 + -2) + 5;
    do {
      iVar3 = -(uint)(pInOut[(lVar1 + -4) - (long)iQ] < pInOut[(lVar1 + -4) - (long)jQ]);
      if (pInOut[(lVar1 + -4) - (long)jQ] < pInOut[(lVar1 + -4) - (long)iQ]) {
        iVar3 = 1;
      }
      if (iVar3 != 0) {
        if (iVar3 == -1) goto LAB_00561b10;
        iVar3 = 1;
        goto LAB_00561b19;
      }
      iVar2 = iVar2 + -4;
      lVar1 = lVar1 + -4;
    } while (3 < lVar1);
  }
  iVar2 = 0;
LAB_00561b10:
  iVar3 = 0;
LAB_00561b19:
  *pDifStart = iVar2;
  return iVar3;
}

Assistant:

int minTemp2_fast_iVar5(unsigned* pInOut, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp2_fast_iVar5\n");

    for(i=(nWords)*2 - 1; i>=0; i-=4)   
    {
        temp = CompareWords(pInOut[i-iQ],pInOut[i-jQ]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+1;
            return 0;
        }
        else
        {
            *pDifStart = i+1;
            return 1;
        }
    }
    *pDifStart=0;
    return 0;
}